

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iidentity8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int iVar33;
  int in_ECX;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  int local_1ac;
  longlong local_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  int local_17c;
  int local_178;
  __m128i *local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  local_68._0_4_ = (int)uVar1;
  local_68._4_4_ = (int)((ulong)uVar1 >> 0x20);
  uStack_60._0_4_ = (int)uVar2;
  uStack_60._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_78._0_4_ = (int)uVar3;
  local_78._4_4_ = (int)((ulong)uVar3 >> 0x20);
  uStack_70._0_4_ = (int)uVar4;
  uStack_70._4_4_ = (int)((ulong)uVar4 >> 0x20);
  *(int *)*in_RSI = (int)local_68 + (int)local_78;
  *(int *)((long)*in_RSI + 4) = local_68._4_4_ + local_78._4_4_;
  *(int *)(*in_RSI + 1) = (int)uStack_60 + (int)uStack_70;
  *(int *)((long)*in_RSI + 0xc) = uStack_60._4_4_ + uStack_70._4_4_;
  uVar5 = in_RDI[2];
  uVar6 = in_RDI[3];
  uVar7 = in_RDI[2];
  uVar8 = in_RDI[3];
  local_88._0_4_ = (int)uVar5;
  local_88._4_4_ = (int)((ulong)uVar5 >> 0x20);
  uStack_80._0_4_ = (int)uVar6;
  uStack_80._4_4_ = (int)((ulong)uVar6 >> 0x20);
  local_98._0_4_ = (int)uVar7;
  local_98._4_4_ = (int)((ulong)uVar7 >> 0x20);
  uStack_90._0_4_ = (int)uVar8;
  uStack_90._4_4_ = (int)((ulong)uVar8 >> 0x20);
  *(int *)in_RSI[1] = (int)local_88 + (int)local_98;
  *(int *)((long)in_RSI[1] + 4) = local_88._4_4_ + local_98._4_4_;
  *(int *)(in_RSI[1] + 1) = (int)uStack_80 + (int)uStack_90;
  *(int *)((long)in_RSI[1] + 0xc) = uStack_80._4_4_ + uStack_90._4_4_;
  uVar9 = in_RDI[4];
  uVar10 = in_RDI[5];
  uVar11 = in_RDI[4];
  uVar12 = in_RDI[5];
  local_a8._0_4_ = (int)uVar9;
  local_a8._4_4_ = (int)((ulong)uVar9 >> 0x20);
  uStack_a0._0_4_ = (int)uVar10;
  uStack_a0._4_4_ = (int)((ulong)uVar10 >> 0x20);
  local_b8._0_4_ = (int)uVar11;
  local_b8._4_4_ = (int)((ulong)uVar11 >> 0x20);
  uStack_b0._0_4_ = (int)uVar12;
  uStack_b0._4_4_ = (int)((ulong)uVar12 >> 0x20);
  *(int *)in_RSI[2] = (int)local_a8 + (int)local_b8;
  *(int *)((long)in_RSI[2] + 4) = local_a8._4_4_ + local_b8._4_4_;
  *(int *)(in_RSI[2] + 1) = (int)uStack_a0 + (int)uStack_b0;
  *(int *)((long)in_RSI[2] + 0xc) = uStack_a0._4_4_ + uStack_b0._4_4_;
  uVar13 = in_RDI[6];
  uVar14 = in_RDI[7];
  uVar15 = in_RDI[6];
  uVar16 = in_RDI[7];
  local_c8._0_4_ = (int)uVar13;
  local_c8._4_4_ = (int)((ulong)uVar13 >> 0x20);
  uStack_c0._0_4_ = (int)uVar14;
  uStack_c0._4_4_ = (int)((ulong)uVar14 >> 0x20);
  local_d8._0_4_ = (int)uVar15;
  local_d8._4_4_ = (int)((ulong)uVar15 >> 0x20);
  uStack_d0._0_4_ = (int)uVar16;
  uStack_d0._4_4_ = (int)((ulong)uVar16 >> 0x20);
  *(int *)in_RSI[3] = (int)local_c8 + (int)local_d8;
  *(int *)((long)in_RSI[3] + 4) = local_c8._4_4_ + local_d8._4_4_;
  *(int *)(in_RSI[3] + 1) = (int)uStack_c0 + (int)uStack_d0;
  *(int *)((long)in_RSI[3] + 0xc) = uStack_c0._4_4_ + uStack_d0._4_4_;
  uVar17 = in_RDI[8];
  uVar18 = in_RDI[9];
  uVar19 = in_RDI[8];
  uVar20 = in_RDI[9];
  local_e8._0_4_ = (int)uVar17;
  local_e8._4_4_ = (int)((ulong)uVar17 >> 0x20);
  uStack_e0._0_4_ = (int)uVar18;
  uStack_e0._4_4_ = (int)((ulong)uVar18 >> 0x20);
  local_f8._0_4_ = (int)uVar19;
  local_f8._4_4_ = (int)((ulong)uVar19 >> 0x20);
  uStack_f0._0_4_ = (int)uVar20;
  uStack_f0._4_4_ = (int)((ulong)uVar20 >> 0x20);
  *(int *)in_RSI[4] = (int)local_e8 + (int)local_f8;
  *(int *)((long)in_RSI[4] + 4) = local_e8._4_4_ + local_f8._4_4_;
  *(int *)(in_RSI[4] + 1) = (int)uStack_e0 + (int)uStack_f0;
  *(int *)((long)in_RSI[4] + 0xc) = uStack_e0._4_4_ + uStack_f0._4_4_;
  uVar21 = in_RDI[10];
  uVar22 = in_RDI[0xb];
  uVar23 = in_RDI[10];
  uVar24 = in_RDI[0xb];
  local_108._0_4_ = (int)uVar21;
  local_108._4_4_ = (int)((ulong)uVar21 >> 0x20);
  uStack_100._0_4_ = (int)uVar22;
  uStack_100._4_4_ = (int)((ulong)uVar22 >> 0x20);
  local_118._0_4_ = (int)uVar23;
  local_118._4_4_ = (int)((ulong)uVar23 >> 0x20);
  uStack_110._0_4_ = (int)uVar24;
  uStack_110._4_4_ = (int)((ulong)uVar24 >> 0x20);
  *(int *)in_RSI[5] = (int)local_108 + (int)local_118;
  *(int *)((long)in_RSI[5] + 4) = local_108._4_4_ + local_118._4_4_;
  *(int *)(in_RSI[5] + 1) = (int)uStack_100 + (int)uStack_110;
  *(int *)((long)in_RSI[5] + 0xc) = uStack_100._4_4_ + uStack_110._4_4_;
  uVar25 = in_RDI[0xc];
  uVar26 = in_RDI[0xd];
  uVar27 = in_RDI[0xc];
  uVar28 = in_RDI[0xd];
  local_128._0_4_ = (int)uVar25;
  local_128._4_4_ = (int)((ulong)uVar25 >> 0x20);
  uStack_120._0_4_ = (int)uVar26;
  uStack_120._4_4_ = (int)((ulong)uVar26 >> 0x20);
  local_138._0_4_ = (int)uVar27;
  local_138._4_4_ = (int)((ulong)uVar27 >> 0x20);
  uStack_130._0_4_ = (int)uVar28;
  uStack_130._4_4_ = (int)((ulong)uVar28 >> 0x20);
  *(int *)in_RSI[6] = (int)local_128 + (int)local_138;
  *(int *)((long)in_RSI[6] + 4) = local_128._4_4_ + local_138._4_4_;
  *(int *)(in_RSI[6] + 1) = (int)uStack_120 + (int)uStack_130;
  *(int *)((long)in_RSI[6] + 0xc) = uStack_120._4_4_ + uStack_130._4_4_;
  uVar29 = in_RDI[0xe];
  uVar30 = in_RDI[0xf];
  uVar31 = in_RDI[0xe];
  uVar32 = in_RDI[0xf];
  local_148._0_4_ = (int)uVar29;
  local_148._4_4_ = (int)((ulong)uVar29 >> 0x20);
  uStack_140._0_4_ = (int)uVar30;
  uStack_140._4_4_ = (int)((ulong)uVar30 >> 0x20);
  local_158._0_4_ = (int)uVar31;
  local_158._4_4_ = (int)((ulong)uVar31 >> 0x20);
  uStack_150._0_4_ = (int)uVar32;
  uStack_150._4_4_ = (int)((ulong)uVar32 >> 0x20);
  *(int *)in_RSI[7] = (int)local_148 + (int)local_158;
  *(int *)((long)in_RSI[7] + 4) = local_148._4_4_ + local_158._4_4_;
  *(int *)(in_RSI[7] + 1) = (int)uStack_140 + (int)uStack_150;
  *(int *)((long)in_RSI[7] + 0xc) = uStack_140._4_4_ + uStack_150._4_4_;
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_1ac = 0x10;
    }
    else {
      local_1ac = in_R8D + 6;
    }
    local_17c = local_1ac;
    iVar33 = local_17c;
    local_17c._0_1_ = (char)local_1ac;
    local_4c = -(1 << ((char)local_17c - 1U & 0x1f));
    local_198 = CONCAT44(local_4c,local_4c);
    lStack_190 = CONCAT44(local_4c,local_4c);
    local_50 = (1 << ((char)local_17c - 1U & 0x1f)) + -1;
    local_1a8 = CONCAT44(local_50,local_50);
    lStack_1a0 = CONCAT44(local_50,local_50);
    local_17c = iVar33;
    local_178 = in_R9D;
    local_168 = in_RSI;
    local_158 = uVar31;
    uStack_150 = uVar32;
    local_148 = uVar29;
    uStack_140 = uVar30;
    local_138 = uVar27;
    uStack_130 = uVar28;
    local_128 = uVar25;
    uStack_120 = uVar26;
    local_118 = uVar23;
    uStack_110 = uVar24;
    local_108 = uVar21;
    uStack_100 = uVar22;
    local_f8 = uVar19;
    uStack_f0 = uVar20;
    local_e8 = uVar17;
    uStack_e0 = uVar18;
    local_d8 = uVar15;
    uStack_d0 = uVar16;
    local_c8 = uVar13;
    uStack_c0 = uVar14;
    local_b8 = uVar11;
    uStack_b0 = uVar12;
    local_a8 = uVar9;
    uStack_a0 = uVar10;
    local_98 = uVar7;
    uStack_90 = uVar8;
    local_88 = uVar5;
    uStack_80 = uVar6;
    local_78 = uVar3;
    uStack_70 = uVar4;
    local_68 = uVar1;
    uStack_60 = uVar2;
    local_48 = local_198;
    lStack_40 = lStack_190;
    local_38 = local_4c;
    local_34 = local_4c;
    local_30 = local_4c;
    local_2c = local_4c;
    local_28 = local_1a8;
    lStack_20 = lStack_1a0;
    local_10 = local_50;
    local_c = local_50;
    local_8 = local_50;
    local_4 = local_50;
    round_shift_4x4(in_RSI,in_R9D);
    round_shift_4x4(local_168 + 4,local_178);
    highbd_clamp_epi32_sse4_1(local_168,local_168,(__m128i *)&local_198,(__m128i *)&local_1a8,8);
  }
  return;
}

Assistant:

static void iidentity8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  (void)bit;
  out[0] = _mm_add_epi32(in[0], in[0]);
  out[1] = _mm_add_epi32(in[1], in[1]);
  out[2] = _mm_add_epi32(in[2], in[2]);
  out[3] = _mm_add_epi32(in[3], in[3]);
  out[4] = _mm_add_epi32(in[4], in[4]);
  out[5] = _mm_add_epi32(in[5], in[5]);
  out[6] = _mm_add_epi32(in[6], in[6]);
  out[7] = _mm_add_epi32(in[7], in[7]);

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 8);
  }
}